

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int IoTHubTransport_MQTT_Common_DeviceMethod_Response
              (TRANSPORT_LL_HANDLE handle,METHOD_HANDLE methodId,uchar *response,size_t respSize,
              int status)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  MQTTTRANSPORT_HANDLE_DATA *transport_data;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  DEVICE_METHOD_INFO *dev_method_info;
  int result;
  int status_local;
  size_t respSize_local;
  uchar *response_local;
  METHOD_HANDLE methodId_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (methodId == (METHOD_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_DeviceMethod_Response",0xdac,1,
                "Failure: DEVICE_METHOD_INFO is NULL");
    }
    dev_method_info._0_4_ = 0xdad;
  }
  else if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_DeviceMethod_Response",0xdb1,1,
                "Failure: TRANSPORT_LL_HANDLE is NULL");
    }
    dev_method_info._0_4_ = 0xdb2;
    STRING_delete(*methodId);
    free(methodId);
  }
  else {
    iVar1 = publishDeviceMethodResponseMsg
                      ((MQTTTRANSPORT_HANDLE_DATA *)handle,status,*methodId,response,respSize);
    if (iVar1 == 0) {
      dev_method_info._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"IoTHubTransport_MQTT_Common_DeviceMethod_Response",0xdbb,1,
                  "Failure: publishing device method response");
      }
      dev_method_info._0_4_ = 0xdbc;
    }
    STRING_delete(*methodId);
    free(methodId);
  }
  return (int)dev_method_info;
}

Assistant:

int IoTHubTransport_MQTT_Common_DeviceMethod_Response(TRANSPORT_LL_HANDLE handle, METHOD_HANDLE methodId, const unsigned char* response, size_t respSize, int status)
{
    int result;
    DEVICE_METHOD_INFO* dev_method_info = (DEVICE_METHOD_INFO*)methodId;
    if (dev_method_info == NULL)
    {
        LogError("Failure: DEVICE_METHOD_INFO is NULL");
        result = MU_FAILURE;
    }
    else if (handle == NULL)
    {
        LogError("Failure: TRANSPORT_LL_HANDLE is NULL");
        result = MU_FAILURE;
        STRING_delete(dev_method_info->request_id);
        free(dev_method_info);
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* transport_data = (MQTTTRANSPORT_HANDLE_DATA*)handle;
        if (publishDeviceMethodResponseMsg(transport_data, status, dev_method_info->request_id, response, respSize) != 0)
        {
            LogError("Failure: publishing device method response");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
      
        STRING_delete(dev_method_info->request_id);
        free(dev_method_info);
    }

    return result;
}